

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((((pIVar3->Appearing == true) &&
       (pIVar4 = GImGui->NavWindow, pIVar4 == pIVar3->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar4->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar5->NavInitResultId = (pIVar4->DC).LastItemId;
    IVar1 = (pIVar4->DC).LastItemRect.Min;
    IVar2 = (pIVar4->DC).LastItemRect.Max;
    fVar8 = (pIVar4->Pos).x;
    fVar7 = (pIVar4->Pos).y;
    (pIVar5->NavInitResultRectRel).Min.x = IVar1.x - fVar8;
    (pIVar5->NavInitResultRectRel).Min.y = IVar1.y - fVar7;
    (pIVar5->NavInitResultRectRel).Max.x = IVar2.x - fVar8;
    (pIVar5->NavInitResultRectRel).Max.y = IVar2.y - fVar7;
    pIVar5->NavAnyRequest = pIVar5->NavMoveRequest;
    bVar6 = IsItemVisible();
    if (!bVar6) {
      fVar8 = (pIVar5->Style).ItemSpacing.y * 0.0;
      SetScrollFromPosY((pIVar3->DC).PrevLineSize.y * 0.5 + fVar8 + fVar8 +
                        ((pIVar3->DC).CursorPosPrevLine.y - (pIVar3->Pos).y),0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}